

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void kj::copyContents(Directory *to,ReadableDirectory *from)

{
  PathPtr fromPath;
  Array<kj::ReadableDirectory::Entry> *from_00;
  ReadableDirectory *to_00;
  Entry *pEVar1;
  String *name;
  PathPtr local_98;
  ArrayPtr<const_kj::String> local_88;
  undefined1 local_78 [8];
  Path subPath;
  Entry *entry;
  Entry *__end1;
  Entry *local_40;
  Entry *__begin1;
  Array<kj::ReadableDirectory::Entry> *local_20;
  Array<kj::ReadableDirectory::Entry> *__range1;
  ReadableDirectory *from_local;
  Directory *to_local;
  
  __range1 = (Array<kj::ReadableDirectory::Entry> *)from;
  from_local = &to->super_ReadableDirectory;
  (*(from->super_FsNode)._vptr_FsNode[7])();
  local_20 = (Array<kj::ReadableDirectory::Entry> *)&__begin1;
  local_40 = Array<kj::ReadableDirectory::Entry>::begin
                       ((Array<kj::ReadableDirectory::Entry> *)&__begin1);
  pEVar1 = Array<kj::ReadableDirectory::Entry>::end(local_20);
  for (; local_40 != pEVar1; local_40 = local_40 + 1) {
    subPath.parts.disposer = (ArrayDisposer *)local_40;
    name = mv<kj::String>(&local_40->name);
    Path::Path((Path *)local_78,name);
    to_00 = from_local;
    PathPtr::PathPtr((PathPtr *)&local_88,(Path *)local_78);
    from_00 = __range1;
    PathPtr::PathPtr(&local_98,(Path *)local_78);
    fromPath.parts.size_ = local_98.parts.size_;
    fromPath.parts.ptr = local_98.parts.ptr;
    tryCopyDirectoryEntry
              ((Directory *)to_00,(PathPtr)local_88,CREATE,(ReadableDirectory *)from_00,fromPath,
               *(Type *)&(subPath.parts.disposer)->_vptr_ArrayDisposer,false);
    Path::~Path((Path *)local_78);
  }
  Array<kj::ReadableDirectory::Entry>::~Array((Array<kj::ReadableDirectory::Entry> *)&__begin1);
  return;
}

Assistant:

static void copyContents(const Directory& to, const ReadableDirectory& from) {
  for (auto& entry: from.listEntries()) {
    Path subPath(kj::mv(entry.name));
    tryCopyDirectoryEntry(to, subPath, WriteMode::CREATE, from, subPath, entry.type, false);
  }
}